

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

rnndelem * copydelem(rnndelem *elem,char *file)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  rnnenum *prVar7;
  char *pcVar8;
  rnnaccess rVar9;
  undefined4 uVar10;
  rnndelem *prVar11;
  rnndelem **pprVar12;
  rnndelem *prVar13;
  int iVar14;
  long lVar15;
  
  prVar11 = (rnndelem *)calloc(0x108,1);
  prVar11->type = elem->type;
  prVar11->name = elem->name;
  rVar9 = elem->access;
  prVar11->width = elem->width;
  prVar11->access = rVar9;
  uVar3 = elem->length;
  prVar11->offset = elem->offset;
  prVar11->length = uVar3;
  prVar11->stride = elem->stride;
  pcVar4 = (elem->varinfo).prefixstr;
  pcVar5 = (elem->varinfo).varsetstr;
  pcVar6 = (elem->varinfo).variantsstr;
  iVar14 = (elem->varinfo).dead;
  uVar10 = *(undefined4 *)&(elem->varinfo).field_0x1c;
  prVar7 = (elem->varinfo).prefenum;
  pcVar8 = (elem->varinfo).prefix;
  iVar1 = (elem->varinfo).varsetsnum;
  iVar2 = (elem->varinfo).varsetsmax;
  (prVar11->varinfo).varsets = (elem->varinfo).varsets;
  (prVar11->varinfo).varsetsnum = iVar1;
  (prVar11->varinfo).varsetsmax = iVar2;
  (prVar11->varinfo).prefenum = prVar7;
  (prVar11->varinfo).prefix = pcVar8;
  (prVar11->varinfo).variantsstr = pcVar6;
  (prVar11->varinfo).dead = iVar14;
  *(undefined4 *)&(prVar11->varinfo).field_0x1c = uVar10;
  (prVar11->varinfo).prefixstr = pcVar4;
  (prVar11->varinfo).varsetstr = pcVar5;
  prVar11->file = file;
  copytypeinfo(&prVar11->typeinfo,&elem->typeinfo,file);
  for (lVar15 = 0; lVar15 < elem->subelemsnum; lVar15 = lVar15 + 1) {
    iVar1 = prVar11->subelemsnum;
    iVar2 = prVar11->subelemsmax;
    if (iVar2 <= iVar1) {
      iVar14 = iVar2 * 2;
      if (iVar2 == 0) {
        iVar14 = 0x10;
      }
      prVar11->subelemsmax = iVar14;
      pprVar12 = (rnndelem **)realloc(prVar11->subelems,(long)iVar14 << 3);
      prVar11->subelems = pprVar12;
    }
    prVar13 = copydelem(elem->subelems[lVar15],file);
    prVar11->subelemsnum = iVar1 + 1;
    prVar11->subelems[iVar1] = prVar13;
  }
  return prVar11;
}

Assistant:

static struct rnndelem *copydelem (struct rnndelem *elem, char *file) {
	struct rnndelem *res = calloc (sizeof *res, 1);
	res->type = elem->type;
	res->name = elem->name;
	res->width = elem->width;
	res->access = elem->access;
	res->offset = elem->offset;
	res->length = elem->length;
	res->stride = elem->stride;
	res->varinfo = elem->varinfo;
	res->file = file;
	copytypeinfo(&res->typeinfo, &elem->typeinfo, file);
	int i;
	for (i = 0; i < elem->subelemsnum; i++)
		ADDARRAY(res->subelems, copydelem(elem->subelems[i], file));
	return res;
}